

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O2

void __thiscall
AstWalker::visitFunctionDeclarationExpressionAstNode
          (AstWalker *this,FunctionDeclarationExpressionAstNode *node)

{
  pointer psVar1;
  shared_ptr<StatementAstNode> *statement;
  pointer psVar2;
  
  (*this->_vptr_AstWalker[0x1f])();
  psVar1 = (node->statements).
           super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (node->statements).
                super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    (*this->_vptr_AstWalker[2])
              (this,(psVar2->super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr);
  }
  (*this->_vptr_AstWalker[0x2e])(this,node);
  return;
}

Assistant:

void AstWalker::visitFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept {
  this->onEnterFunctionDeclarationExpressionAstNode(node);
  for (auto & statement : node->statements) {
    this->visitStatementAstNode(statement.get());
  }
  this->onExitFunctionDeclarationExpressionAstNode(node);
}